

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O1

void __thiscall Ptex::v2_2::PtexReaderCache::purge(PtexReaderCache *this,PtexCachedReader *reader)

{
  size_t *psVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar4 = 0;
  LOCK();
  uVar2 = reader->_refCount;
  bVar6 = uVar2 == 0;
  if (bVar6) {
    reader->_refCount = -1;
  }
  else {
    uVar4 = (ulong)uVar2;
  }
  UNLOCK();
  if (bVar6) {
    PtexReader::purge(&reader->super_PtexReader);
    sVar3 = (reader->super_PtexReader)._memUsed;
    uVar4 = sVar3 - reader->_memUsedAccountedFor;
    reader->_memUsedAccountedFor = sVar3;
    reader->_refCount = 0;
  }
  else {
    (reader->super_PtexReader)._pendingPurge = true;
  }
  if (bVar6 && uVar4 != 0) {
    LOCK();
    psVar1 = &this->_memUsed;
    sVar3 = *psVar1;
    *psVar1 = *psVar1 + uVar4;
    UNLOCK();
    uVar5 = sVar3 + uVar4;
    if (sVar3 + uVar4 < this->_peakMemUsed) {
      uVar5 = this->_peakMemUsed;
    }
    this->_peakMemUsed = uVar5;
  }
  return;
}

Assistant:

void PtexReaderCache::purge(PtexCachedReader* reader)
{
    size_t memUsedChange;
    if (reader->tryPurge(memUsedChange)) {
        adjustMemUsed(memUsedChange);
    }
}